

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  
  psVar2 = GetDef(this,name);
  if (psVar2 == (string *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (psVar2->_M_dataplus)._M_p;
  }
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    bVar1 = false;
  }
  else {
    bVar1 = cmSystemTools::IsNOTFOUND((char *)0x232caf);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  const char* value = this->GetDefinition(name);
  if (!value) {
    return false;
  }

  if (!*value) {
    return false;
  }

  if (cmSystemTools::IsNOTFOUND(value)) {
    return false;
  }

  return true;
}